

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::compileBootstrapValue
          (NodeTranslator *this,Reader source,Reader type,Builder target,
          Maybe<capnp::Schema> *typeScope)

{
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> **ppRVar1;
  bool bVar2;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar3;
  long lVar4;
  size_t newSize;
  SegmentReader **ppSVar5;
  Schema typeScope_00;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar6;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 unaff_R15;
  byte bVar7;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  void *local_78;
  WirePointer *pWStack_70;
  StructDataBitCount local_68;
  StructPointerCount SStack_64;
  undefined2 uStack_62;
  int iStack_60;
  undefined4 uStack_5c;
  SegmentReader *local_58;
  CapTableReader *pCStack_50;
  void *local_48;
  WirePointer *pWStack_40;
  undefined8 local_38;
  int iStack_30;
  undefined4 uStack_2c;
  
  bVar7 = 0;
  compileDefaultDefaultValue(this,type,target);
  if (0xf < type._reader.dataSize) {
    if ((*type._reader.data < 0x13) && ((0x74000U >> (*type._reader.data & 0x1f) & 1) != 0)) {
      local_68 = source._reader.dataSize;
      SStack_64 = source._reader.pointerCount;
      uStack_62 = source._reader._38_2_;
      iStack_60 = source._reader.nestingLimit;
      uStack_5c = source._reader._44_4_;
      local_78 = source._reader.data;
      pWStack_70 = source._reader.pointers;
      local_88 = source._reader.segment;
      pCStack_80 = source._reader.capTable;
      local_38 = type._reader._32_8_;
      iStack_30 = type._reader.nestingLimit;
      uStack_2c = type._reader._44_4_;
      local_48 = type._reader.data;
      pWStack_40 = type._reader.pointers;
      local_58 = type._reader.segment;
      pCStack_50 = type._reader.capTable;
      bVar2 = (typeScope->ptr).isSet;
      if (bVar2 == true) {
        unaff_R15 = (typeScope->ptr).field_1;
      }
      pRVar3 = (this->unfinishedValues).builder.pos;
      if (pRVar3 == (this->unfinishedValues).builder.endPtr) {
        pRVar6 = (this->unfinishedValues).builder.ptr;
        newSize = 4;
        if (pRVar3 != pRVar6) {
          newSize = ((long)pRVar3 - (long)pRVar6 >> 3) * 0xd79435e50d79436;
        }
        kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::setCapacity
                  (&this->unfinishedValues,newSize);
        pRVar3 = (this->unfinishedValues).builder.pos;
      }
      ppSVar5 = &local_88;
      pRVar6 = pRVar3;
      for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pRVar6->source)._reader.segment = *ppSVar5;
        ppSVar5 = ppSVar5 + (ulong)bVar7 * -2 + 1;
        pRVar6 = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)
                 ((long)pRVar6 + (ulong)bVar7 * -0x10 + 8);
      }
      (pRVar3->typeScope).ptr.isSet = bVar2;
      if (bVar2 != false) {
        (pRVar3->typeScope).ptr.field_1 = unaff_R15;
      }
      (pRVar3->target)._builder.dataSize = target._builder.dataSize;
      (pRVar3->target)._builder.pointerCount = target._builder.pointerCount;
      *(undefined2 *)&(pRVar3->target)._builder.field_0x26 = target._builder._38_2_;
      (pRVar3->target)._builder.data = target._builder.data;
      (pRVar3->target)._builder.pointers = target._builder.pointers;
      (pRVar3->target)._builder.segment = target._builder.segment;
      (pRVar3->target)._builder.capTable = target._builder.capTable;
      ppRVar1 = &(this->unfinishedValues).builder.pos;
      *ppRVar1 = *ppRVar1 + 1;
      return;
    }
  }
  if ((typeScope->ptr).isSet == true) {
    typeScope_00.raw = (typeScope->ptr).field_1.value.raw;
  }
  else {
    typeScope_00.raw = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
  }
  compileValue(this,source,type,typeScope_00,target,true);
  return;
}

Assistant:

void NodeTranslator::compileBootstrapValue(
    Expression::Reader source, schema::Type::Reader type, schema::Value::Builder target,
    kj::Maybe<Schema> typeScope) {
  // Start by filling in a default default value so that if for whatever reason we don't end up
  // initializing the value, this won't cause schema validation to fail.
  compileDefaultDefaultValue(type, target);

  switch (type.which()) {
    case schema::Type::LIST:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
    case schema::Type::ANY_POINTER:
      unfinishedValues.add(UnfinishedValue { source, type, typeScope, target });
      break;

    default:
      // Primitive value. (Note that the scope can't possibly matter since primitives are not
      // generic.)
      compileValue(source, type, typeScope.orDefault(Schema()), target, true);
      break;
  }
}